

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall Engine::saveCurrentSolution(Engine *this)

{
  uint uVar1;
  vec<IntVar_*> *in_RDI;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar2;
  uint index;
  
  SAT::saveCurrentPolarities((SAT *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  uVar2 = 0;
  while( true ) {
    index = uVar2;
    uVar1 = vec<IntVar_*>::size(in_RDI);
    if (uVar1 <= uVar2) break;
    vec<IntVar_*>::operator[](in_RDI,index);
    IntVar::saveCurrentValue((IntVar *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
    uVar2 = index + 1;
  }
  return;
}

Assistant:

void Engine::saveCurrentSolution() {
	sat.saveCurrentPolarities();                      // SAT vars
	for (unsigned int i = 0; i < vars.size(); i++) {  // Int vars
		vars[i]->saveCurrentValue();
	}
}